

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_sse4.c
# Opt level: O0

double aom_compute_correlation_sse4_1
                 (uchar *frame1,int stride1,int x1,int y1,double mean1,double one_over_stddev1,
                 uchar *frame2,int stride2,int x2,int y2,double mean2,double one_over_stddev2)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  double in_XMM0_Qa;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  __m128i v1;
  int in_stack_00000010;
  int i;
  __m128i cross_vec_r;
  __m128i cross_vec_l;
  int local_18c;
  int local_188;
  int iStack_184;
  int iStack_180;
  int iStack_17c;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  undefined1 (*local_148) [16];
  undefined1 (*local_120) [16];
  undefined8 local_e8;
  undefined8 local_c8;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  double correlation;
  double covariance;
  int iStack_68;
  int cross;
  __m128i tmp;
  __m128i v2_r;
  __m128i v2_l;
  __m128i v1_r;
  __m128i v1_l;
  __m128i v2;
  
  local_178 = 0;
  iStack_174 = 0;
  iStack_170 = 0;
  iStack_16c = 0;
  local_188 = 0;
  iStack_184 = 0;
  iStack_180 = 0;
  iStack_17c = 0;
  local_120 = (undefined1 (*) [16])(in_RDI + ((in_ECX + -7) * in_ESI + in_EDX + -7));
  local_148 = (undefined1 (*) [16])(in_R8 + ((in_stack_00000010 + -7) * in_R9D + (int)v1[1] + -7));
  for (local_18c = 0; local_18c < 0x10; local_18c = local_18c + 1) {
    auVar1 = pmovzxbw(*local_120,*(undefined8 *)*local_120);
    local_c8 = SUB168(*local_120,8);
    auVar2 = pmovzxbw(*local_120 >> 0x40,local_c8);
    auVar3 = pmovzxbw(*local_148,*(undefined8 *)*local_148);
    local_e8 = SUB168(*local_148,8);
    auVar4 = pmovzxbw(*local_148 >> 0x40,local_e8);
    auVar1 = pmaddwd(auVar1,auVar3);
    iStack_68 = auVar1._0_4_;
    cross = auVar1._4_4_;
    tmp[0]._0_4_ = auVar1._8_4_;
    tmp[0]._4_4_ = auVar1._12_4_;
    local_178 = local_178 + iStack_68;
    iStack_174 = iStack_174 + cross;
    iStack_170 = iStack_170 + (int)tmp[0];
    iStack_16c = iStack_16c + tmp[0]._4_4_;
    auVar1 = pmaddwd(auVar2,auVar4);
    local_88 = auVar1._0_4_;
    iStack_84 = auVar1._4_4_;
    iStack_80 = auVar1._8_4_;
    iStack_7c = auVar1._12_4_;
    local_188 = local_188 + local_88;
    iStack_184 = iStack_184 + iStack_84;
    iStack_180 = iStack_180 + iStack_80;
    iStack_17c = iStack_17c + iStack_7c;
    local_120 = (undefined1 (*) [16])(*local_120 + in_ESI);
    local_148 = (undefined1 (*) [16])(*local_148 + in_R9D);
  }
  return (-in_XMM0_Qa * in_XMM2_Qa +
         (double)(local_178 + local_188 + iStack_174 + iStack_184 + iStack_170 + iStack_180 +
                 iStack_16c + iStack_17c)) * in_XMM1_Qa * in_XMM3_Qa;
}

Assistant:

double aom_compute_correlation_sse4_1(const unsigned char *frame1, int stride1,
                                      int x1, int y1, double mean1,
                                      double one_over_stddev1,
                                      const unsigned char *frame2, int stride2,
                                      int x2, int y2, double mean2,
                                      double one_over_stddev2) {
  // 8 32-bit partial sums of products
  __m128i cross_vec_l = _mm_setzero_si128();
  __m128i cross_vec_r = _mm_setzero_si128();

  frame1 += (y1 - MATCH_SZ_BY2) * stride1 + (x1 - MATCH_SZ_BY2);
  frame2 += (y2 - MATCH_SZ_BY2) * stride2 + (x2 - MATCH_SZ_BY2);

  for (int i = 0; i < MATCH_SZ; ++i) {
    const __m128i v1 = _mm_loadu_si128((__m128i *)frame1);
    const __m128i v2 = _mm_loadu_si128((__m128i *)frame2);

    const __m128i v1_l = _mm_cvtepu8_epi16(v1);
    const __m128i v1_r = _mm_cvtepu8_epi16(_mm_srli_si128(v1, 8));
    const __m128i v2_l = _mm_cvtepu8_epi16(v2);
    const __m128i v2_r = _mm_cvtepu8_epi16(_mm_srli_si128(v2, 8));

    cross_vec_l = _mm_add_epi32(cross_vec_l, _mm_madd_epi16(v1_l, v2_l));
    cross_vec_r = _mm_add_epi32(cross_vec_r, _mm_madd_epi16(v1_r, v2_r));

    frame1 += stride1;
    frame2 += stride2;
  }

  // Sum cross_vec into a single value
  const __m128i tmp = _mm_add_epi32(cross_vec_l, cross_vec_r);
  const int cross = _mm_extract_epi32(tmp, 0) + _mm_extract_epi32(tmp, 1) +
                    _mm_extract_epi32(tmp, 2) + _mm_extract_epi32(tmp, 3);

  // Note: In theory, the calculations here "should" be
  //   covariance = cross / N^2 - mean1 * mean2
  //   correlation = covariance / (stddev1 * stddev2).
  //
  // However, because of the scaling in aom_compute_mean_stddev, the
  // lines below actually calculate
  //   covariance * N^2 = cross - (mean1 * N) * (mean2 * N)
  //   correlation = (covariance * N^2) / ((stddev1 * N) * (stddev2 * N))
  //
  // ie. we have removed the need for a division, and still end up with the
  // correct unscaled correlation (ie, in the range [-1, +1])
  const double covariance = cross - mean1 * mean2;
  const double correlation = covariance * (one_over_stddev1 * one_over_stddev2);
  return correlation;
}